

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O0

void pzshape::TPZShapeCube::SideShape
               (int side,TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,
               TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  TPZVec<double> *in_RCX;
  int in_EDI;
  TPZVec<long> *in_R8;
  TPZVec<int> *in_R9;
  TPZFMatrix<double> *in_stack_00000a60;
  TPZFMatrix<double> *in_stack_00000a68;
  TPZVec<int> *in_stack_00000a70;
  TPZVec<long> *in_stack_00000a78;
  TPZVec<double> *in_stack_00000a80;
  TPZFMatrix<double> *in_stack_00000f50;
  TPZFMatrix<double> *in_stack_00000f58;
  TPZVec<int> *in_stack_00000f60;
  TPZVec<long> *in_stack_00000f68;
  TPZVec<double> *in_stack_00000f70;
  TPZFMatrix<double> *in_stack_000016e0;
  TPZFMatrix<double> *in_stack_000016e8;
  TPZVec<int> *in_stack_000016f0;
  TPZVec<long> *in_stack_000016f8;
  TPZVec<double> *in_stack_00001700;
  TPZFMatrix<double> *in_stack_ffffffffffffffc8;
  
  if ((in_EDI < 0) || (0x1a < in_EDI)) {
    std::operator<<((ostream *)&std::cerr,"TPZCompElC3d::SideShapeFunction. Bad paramenter side.\n")
    ;
  }
  else if (in_EDI == 0x1a) {
    Shape(in_stack_00001700,in_stack_000016f8,in_stack_000016f0,in_stack_000016e8,in_stack_000016e0)
    ;
  }
  else if (in_EDI < 8) {
    TPZShapePoint::Shape
              (in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,(TPZFMatrix<double> *)0x18774d6);
  }
  else if (in_EDI < 0x14) {
    TPZShapeLinear::Shape
              (in_stack_00000a80,in_stack_00000a78,in_stack_00000a70,in_stack_00000a68,
               in_stack_00000a60);
  }
  else if (in_EDI < 0x1a) {
    TPZShapeQuad::Shape(in_stack_00000f70,in_stack_00000f68,in_stack_00000f60,in_stack_00000f58,
                        in_stack_00000f50);
  }
  else {
    Shape(in_stack_00001700,in_stack_000016f8,in_stack_000016f0,in_stack_000016e8,in_stack_000016e0)
    ;
  }
  return;
}

Assistant:

void TPZShapeCube::SideShape(int side, TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		if(side<0 || side>26) PZError << "TPZCompElC3d::SideShapeFunction. Bad paramenter side.\n";
		else if(side==26) Shape(pt,id,order,phi,dphi);
		else if(side<8) TPZShapePoint::Shape(pt,id,order,phi,dphi);
		else if(side<20) {//8 a 19
			TPZShapeLinear::Shape(pt,id,order,phi,dphi);
		}
		else if(side<26) {//faces
			TPZShapeQuad::Shape(pt,id,order,phi,dphi);
		}
		else
		{
			Shape(pt,id,order,phi,dphi);
		}
	}